

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dog.c
# Opt level: O0

int dogfood(monst *mon,obj *obj)

{
  boolean bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int local_60;
  int local_58;
  int local_54;
  int local_4c;
  boolean starving;
  permonst *fptr;
  boolean herbi;
  boolean carni;
  obj *obj_local;
  monst *mon_local;
  
  bVar5 = (mon->data->mflags1 & 0x20000000) != 0;
  bVar6 = (mon->data->mflags1 & 0x40000000) != 0;
  lVar3 = (long)obj->corpsenm;
  lVar4 = lVar3 * 0x40;
  bVar1 = is_quest_artifact(obj);
  if ((bVar1 == '\0') && (bVar1 = obj_resists(obj,0,0x5f), bVar1 == '\0')) {
    if (obj->oclass == '\a') {
      if ((obj->otyp == 0x10e) &&
         ((((((long)obj->corpsenm & 0x3ffffffffffffffU) == 0xc ||
            (((long)obj->corpsenm & 0x3ffffffffffffffU) == 0xb)) && ((mon->mintrinsics & 0x80) == 0)
           ) || (((lVar4 == 0x5100 || (lVar4 == 0x5180)) || (lVar4 == 0x5140)))))) {
        mon_local._4_4_ = 7;
      }
      else if (mon->data == mons + 0xfd) {
        bVar5 = false;
        if (obj->otyp == 0x10e) {
          lVar3 = peek_at_iced_corpse_age(obj);
          bVar5 = lVar3 + 0x32 <= (long)(ulong)moves;
        }
        mon_local._4_4_ = 7;
        if (bVar5) {
          mon_local._4_4_ = 0;
        }
      }
      else if (((mon->data->mlet == '0') || ((mon->data->mflags2 & 0x100) != 0)) ||
              (mon->data == mons + 0x85)) {
        bVar5 = false;
        if (((((((obj->otyp == 0x10e) && (bVar5 = false, mons[obj->corpsenm].mlet != '\x02')) &&
               (bVar5 = false, mons[obj->corpsenm].mlet != '\n')) &&
              ((bVar5 = false, mons[obj->corpsenm].mlet != ' ' &&
               (bVar5 = false, mons[obj->corpsenm].mlet != '\x16')))) &&
             (((bVar5 = false, mons[obj->corpsenm].mlet != '\x19' &&
               ((mons[obj->corpsenm].mlet != '\x1f' ||
                (bVar5 = false, ((long)obj->corpsenm & 0x3ffffffffffffffU) == 0x9e)))) &&
              ((mons[obj->corpsenm].mlet != '7' ||
               ((((long)obj->corpsenm & 0x3ffffffffffffffU) == 0x106 ||
                (bVar5 = false, ((long)obj->corpsenm & 0x3ffffffffffffffU) == 0x104)))))))) &&
            ((bVar5 = false, mons[obj->corpsenm].mlet != '6' &&
             ((mons[obj->corpsenm].mlet != '*' ||
              (bVar5 = false, ((long)obj->corpsenm & 0x3ffffffffffffffU) == 0xd6)))))) &&
           (((mons[obj->corpsenm].mlet != '7' ||
             (bVar5 = false, ((long)obj->corpsenm & 0x3ffffffffffffffU) == 0x106)) &&
            (((((mons[obj->corpsenm].mflags2 & 2) == 0 || (mons[obj->corpsenm].mlet == '0')) ||
              (bVar5 = false, (mons[obj->corpsenm].mflags2 & 0x100) != 0)) &&
             (bVar5 = false, obj->oeaten == 0)))))) {
          lVar3 = peek_at_iced_corpse_age(obj);
          bVar5 = (long)(ulong)moves <= lVar3 + 5;
        }
        mon_local._4_4_ = 7;
        if (bVar5) {
          mon_local._4_4_ = 0;
        }
      }
      else if ((bVar5) || (bVar6)) {
        bVar7 = false;
        if ((mon->mtame != '\0') && (bVar7 = false, (*(uint *)&mon->field_0x60 >> 0x1a & 1) == 0)) {
          bVar7 = *(int *)&mon[1].minvent != 0;
        }
        switch(obj->otyp) {
        case 0x10d:
        case 0x110:
        case 0x111:
        case 0x112:
        case 0x113:
          mon_local._4_4_ = 3;
          if (bVar5) {
            mon_local._4_4_ = 0;
          }
          break;
        case 0x10e:
          lVar2 = peek_at_iced_corpse_age(obj);
          if (((((((long)(ulong)moves < lVar2 + 0x32) || (obj->corpsenm == 0x154)) ||
                (obj->corpsenm == 0xa3)) || (mon->data->mlet == ' ')) &&
              (((mons[obj->corpsenm].mflags1 & 0x8000000) == 0 || ((mon->mintrinsics & 0x40) != 0)))
              ) && (((mons[obj->corpsenm].mflags1 & 0x10000000) == 0 ||
                    ((mon->mintrinsics & 0x20) != 0)))) {
            if (((((mons[lVar3].mlet == '\x02') || (mons[lVar3].mlet == '\n')) ||
                 ((mons[lVar3].mlet == ' ' ||
                  ((mons[lVar3].mlet == '\x16' || (mons[lVar3].mlet == '\x19')))))) ||
                ((mons[lVar3].mlet == '\x1f' && (lVar4 != 0x2780)))) ||
               ((((mons[lVar3].mlet == '7' && (lVar4 != 0x4180)) && (lVar4 != 0x4100)) ||
                (mons[lVar3].mlet == '6')))) {
              mon_local._4_4_ = 3;
              if (bVar6) {
                mon_local._4_4_ = 1;
              }
            }
            else {
              mon_local._4_4_ = 3;
              if (bVar5) {
                mon_local._4_4_ = 1;
              }
            }
          }
          else {
            mon_local._4_4_ = 5;
          }
          break;
        case 0x10f:
          if (((((long)obj->corpsenm & 0x3ffffffffffffffU) == 0xc) ||
              (((long)obj->corpsenm & 0x3ffffffffffffffU) == 0xb)) &&
             ((mon->mintrinsics & 0x80) == 0)) {
            mon_local._4_4_ = 5;
          }
          else {
            mon_local._4_4_ = 3;
            if (bVar5) {
              mon_local._4_4_ = 1;
            }
          }
          break;
        default:
          if (bVar7) {
            mon_local._4_4_ = 2;
          }
          else {
            if (obj->otyp < 0x11f) {
              local_60 = 3;
              if (bVar6) {
                local_60 = 2;
              }
            }
            else {
              local_60 = 3;
              if (bVar5) {
                local_60 = 2;
              }
            }
            mon_local._4_4_ = local_60;
          }
          break;
        case 0x116:
        case 0x11b:
          if (bVar6) {
            local_54 = 0;
          }
          else {
            local_54 = 3;
            if (bVar7) {
              local_54 = 2;
            }
          }
          mon_local._4_4_ = local_54;
          break;
        case 0x11a:
          if (mon->data->mlet == '3') {
            local_58 = 0;
          }
          else {
            bVar5 = true;
            if (!bVar6) {
              bVar5 = bVar7;
            }
            local_58 = 3;
            if (bVar5) {
              local_58 = 2;
            }
          }
          mon_local._4_4_ = local_58;
          break;
        case 0x11d:
          if ((mon->data->mflags2 & 2) == 0) {
            bVar5 = true;
            if (!bVar6) {
              bVar5 = bVar7;
            }
            local_4c = 3;
            if (bVar5) {
              local_4c = 2;
            }
          }
          else {
            local_4c = 7;
          }
          mon_local._4_4_ = local_4c;
          break;
        case 0x129:
          mon_local._4_4_ = 3;
          if ((mon->data->mflags1 & 0x80000000) != 0) {
            mon_local._4_4_ = 2;
          }
        }
      }
      else {
        mon_local._4_4_ = 4;
        if ((*(uint *)&obj->field_0x4a & 1) != 0) {
          mon_local._4_4_ = 6;
        }
      }
    }
    else {
      if (obj->oclass != '\x0e') {
        if ((obj->otyp == 0xcb) || (obj->otyp == 0xb4)) {
          return 7;
        }
        bVar1 = hates_silver(mon->data);
        if ((bVar1 != '\0') && ((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) == 0xe)) {
          return 7;
        }
        if ((mon->data == mons + 10) &&
           ((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) < 9)) {
          return 2;
        }
        if (((((mon->data->mflags1 & 0x80000000) != 0) &&
             (10 < (*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f))) &&
            ((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) < 0x12)) &&
           (((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) == 0xb ||
            (mon->data != mons + 0xd9)))) {
          bVar5 = false;
          if ((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) == 0xb) {
            bVar5 = (*(uint *)&obj->field_0x4a >> 0xc & 1) == 0;
          }
          if (!bVar5) {
            return 2;
          }
          return 0;
        }
        if ((((*(uint *)&obj->field_0x4a & 1) == 0) && (obj->oclass != '\x0f')) &&
           (obj->oclass != '\x10')) {
          return 4;
        }
      }
      mon_local._4_4_ = 6;
    }
  }
  else {
    mon_local._4_4_ = 4;
    if ((*(uint *)&obj->field_0x4a & 1) != 0) {
      mon_local._4_4_ = 7;
    }
  }
  return mon_local._4_4_;
}

Assistant:

int dogfood(struct monst *mon, struct obj *obj)
{
	boolean carni = carnivorous(mon->data);
	boolean herbi = herbivorous(mon->data);
	const struct permonst *fptr = &mons[obj->corpsenm];
	boolean starving;

	if (is_quest_artifact(obj) || obj_resists(obj, 0, 95))
	    return obj->cursed ? TABU : APPORT;

	switch(obj->oclass) {
	case FOOD_CLASS:
	    if (obj->otyp == CORPSE &&
		((touch_petrifies(&mons[obj->corpsenm]) && !resists_ston(mon))
		 || is_rider(fptr)))
		    return TABU;

	    /* Ghouls only eat old corpses... yum! */
	    if (mon->data == &mons[PM_GHOUL])
		return (obj->otyp == CORPSE &&
			peek_at_iced_corpse_age(obj) + 50L <= moves) ?
				DOGFOOD : TABU;

	    /* Vampires only "eat" very fresh corpses ... */
	    /* Assume meat -> blood */
	    if (is_vampiric(mon->data)) {
		return (obj->otyp == CORPSE &&
			has_blood(&mons[obj->corpsenm]) && !obj->oeaten &&
			peek_at_iced_corpse_age(obj) + 5 >= moves) ?
		       DOGFOOD : TABU;
	    }

	    if (!carni && !herbi)
		    return obj->cursed ? UNDEF : APPORT;

	    /* a starving pet will eat almost anything */
	    starving = (mon->mtame && !mon->isminion &&
			EDOG(mon)->mhpmax_penalty);

	    switch (obj->otyp) {
		case TRIPE_RATION:
		case MEATBALL:
		case MEAT_RING:
		case MEAT_STICK:
		case HUGE_CHUNK_OF_MEAT:
		    return carni ? DOGFOOD : MANFOOD;
		case EGG:
		    if (touch_petrifies(&mons[obj->corpsenm]) && !resists_ston(mon))
			return POISON;
		    return carni ? CADAVER : MANFOOD;
		case CORPSE:
		   if ((peek_at_iced_corpse_age(obj) + 50L <= moves
					    && obj->corpsenm != PM_LIZARD
					    && obj->corpsenm != PM_LICHEN
					    && mon->data->mlet != S_FUNGUS) ||
			(acidic(&mons[obj->corpsenm]) && !resists_acid(mon)) ||
			(poisonous(&mons[obj->corpsenm]) &&
						!resists_poison(mon)))
			return POISON;
		    else if (vegan(fptr))
			return herbi ? CADAVER : MANFOOD;
		    else return carni ? CADAVER : MANFOOD;
		case CLOVE_OF_GARLIC:
		    return (is_undead(mon->data) ? TABU :
			    ((herbi || starving) ? ACCFOOD : MANFOOD));
		case TIN:
		    return metallivorous(mon->data) ? ACCFOOD : MANFOOD;
		case APPLE:
		case CARROT:
		    return herbi ? DOGFOOD : starving ? ACCFOOD : MANFOOD;
		case BANANA:
		    return ((mon->data->mlet == S_YETI) ? DOGFOOD :
			    ((herbi || starving) ? ACCFOOD : MANFOOD));
		default:
		    if (starving) return ACCFOOD;
		    return (obj->otyp > SLIME_MOLD ?
			    (carni ? ACCFOOD : MANFOOD) :
			    (herbi ? ACCFOOD : MANFOOD));
	    }
	default:
	    if (obj->otyp == AMULET_OF_STRANGULATION ||
			obj->otyp == RIN_SLOW_DIGESTION)
		return TABU;
	    if (hates_silver(mon->data) &&
		objects[obj->otyp].oc_material == SILVER)
		return TABU;
	    if (mon->data == &mons[PM_GELATINOUS_CUBE] && is_organic(obj))
		return ACCFOOD;
	    if (metallivorous(mon->data) && is_metallic(obj) && (is_rustprone(obj) || mon->data != &mons[PM_RUST_MONSTER])) {
		/* Non-rustproofed ferrous based metals are preferred. */
		return (is_rustprone(obj) && !obj->oerodeproof) ? DOGFOOD : ACCFOOD;
	    }
	    if (!obj->cursed && obj->oclass != BALL_CLASS &&
						obj->oclass != CHAIN_CLASS)
		return APPORT;
	    /* fall into next case */
	case ROCK_CLASS:
	    return UNDEF;
	}
}